

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.c
# Opt level: O1

int glfwPlatformSupported(int platformID)

{
  long lVar1;
  int iVar2;
  
  if (platformID - 0x60006U < 0xfffffffb) {
    iVar2 = 0;
    _glfwInputError(0x10003,"Invalid platform ID 0x%08X");
  }
  else {
    iVar2 = 1;
    if (platformID != 0x60005) {
      lVar1 = 0;
      do {
        if (*(int *)((long)&supportedPlatforms + lVar1) == platformID) {
          return 1;
        }
        lVar1 = lVar1 + 0x10;
      } while (lVar1 == 0x10);
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

GLFWAPI int glfwPlatformSupported(int platformID)
{
    const size_t count = sizeof(supportedPlatforms) / sizeof(supportedPlatforms[0]);
    size_t i;

    if (platformID != GLFW_PLATFORM_WIN32 &&
        platformID != GLFW_PLATFORM_COCOA &&
        platformID != GLFW_PLATFORM_WAYLAND &&
        platformID != GLFW_PLATFORM_X11 &&
        platformID != GLFW_PLATFORM_NULL)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid platform ID 0x%08X", platformID);
        return GLFW_FALSE;
    }

    if (platformID == GLFW_PLATFORM_NULL)
        return GLFW_TRUE;

    for (i = 0;  i < count;  i++)
    {
        if (platformID == supportedPlatforms[i].ID)
            return GLFW_TRUE;
    }

    return GLFW_FALSE;
}